

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdGetBaseTapLeaf(void *handle,void *tree_handle,uint8_t *leaf_version,char **tapscript,
                     char **tap_leaf_hash)

{
  TapBranch *this;
  TaprootScriptTree *this_00;
  bool bVar1;
  uint8_t uVar2;
  char *pcVar3;
  char *pcVar4;
  char *work_tapscript;
  string local_98;
  char *local_78;
  Script local_70;
  char *local_38;
  
  local_78 = (char *)0x0;
  local_38 = (char *)0x0;
  cfd::Initialize();
  local_70._vptr_Script =
       (_func_int **)
       ((long)&local_70.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_70);
  if (local_70._vptr_Script !=
      (_func_int **)
      ((long)&local_70.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 8U)) {
    operator_delete(local_70._vptr_Script);
  }
  this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
  if (this == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
    this_00 = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
    if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this_00) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    if (tapscript == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::TapBranch::GetScript(&local_70,(TapBranch *)this_00);
      cfd::core::Script::GetHex_abi_cxx11_(&local_98,&local_70);
      pcVar3 = cfd::capi::CreateString(&local_98);
      local_78 = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      cfd::core::Script::~Script(&local_70);
    }
    if (tap_leaf_hash == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&local_98,this_00);
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_70,(ByteData256 *)&local_98);
      pcVar4 = cfd::capi::CreateString((string *)&local_70);
      local_38 = pcVar4;
      if (local_70._vptr_Script !=
          (_func_int **)
          ((long)&local_70.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_70._vptr_Script);
      }
      if (local_98._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
    if (leaf_version != (uint8_t *)0x0) {
      uVar2 = cfd::core::TapBranch::GetLeafVersion((TapBranch *)this_00);
      *leaf_version = uVar2;
    }
    goto LAB_003e5373;
  }
  bVar1 = cfd::core::TapBranch::HasTapLeaf(this);
  if (bVar1) {
    if (tapscript == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::TapBranch::GetScript(&local_70,this);
      cfd::core::Script::GetHex_abi_cxx11_(&local_98,&local_70);
      pcVar3 = cfd::capi::CreateString(&local_98);
      local_78 = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      cfd::core::Script::~Script(&local_70);
    }
    if (leaf_version != (uint8_t *)0x0) {
      uVar2 = cfd::core::TapBranch::GetLeafVersion(this);
LAB_003e531a:
      *leaf_version = uVar2;
    }
  }
  else {
    uVar2 = '\0';
    pcVar3 = (char *)0x0;
    if (leaf_version != (uint8_t *)0x0) goto LAB_003e531a;
  }
  if (tap_leaf_hash == (char **)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    cfd::core::TapBranch::GetBaseHash((ByteData256 *)&local_98,this);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_70,(ByteData256 *)&local_98);
    pcVar4 = cfd::capi::CreateString((string *)&local_70);
    if (local_70._vptr_Script !=
        (_func_int **)
        ((long)&local_70.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_70._vptr_Script);
    }
    if (local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
LAB_003e5373:
  if (tapscript != (char **)0x0) {
    *tapscript = pcVar3;
  }
  if (tap_leaf_hash != (char **)0x0) {
    *tap_leaf_hash = pcVar4;
  }
  return 0;
}

Assistant:

int CfdGetBaseTapLeaf(
    void* handle, void* tree_handle, uint8_t* leaf_version, char** tapscript,
    char** tap_leaf_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_tap_leaf_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.HasTapLeaf()) {
        if (tapscript != nullptr) {
          work_tapscript = CreateString(branch.GetScript().GetHex());
        }
        if (leaf_version != nullptr) *leaf_version = branch.GetLeafVersion();
      } else {
        if (leaf_version != nullptr) *leaf_version = 0;
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(branch.GetBaseHash().GetHex());
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tapscript != nullptr) {
        work_tapscript = CreateString(tree.GetScript().GetHex());
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      if (leaf_version != nullptr) *leaf_version = tree.GetLeafVersion();
    }

    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (tap_leaf_hash != nullptr) *tap_leaf_hash = work_tap_leaf_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_tap_leaf_hash);
  return result;
}